

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O2

Maybe<kj::Promise<kj::Own<capnp::ClientHook>_>_> * __thiscall
capnp::anon_unknown_0::MembraneHook::whenMoreResolved
          (Maybe<kj::Promise<kj::Own<capnp::ClientHook>_>_> *__return_storage_ptr__,
          MembraneHook *this)

{
  anon_union_16_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_>_2 *this_00;
  ClientHook *pCVar1;
  TransformPromiseNodeBase *pTVar2;
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> local_a8;
  NullableValue<kj::Promise<void>_> local_90;
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> local_78;
  Own<kj::_::PromiseNode> local_60;
  Own<kj::_::PromiseNode> local_50;
  Own<kj::_::PromiseNode> local_40;
  FixVoid<kj::Own<capnp::ClientHook>_> local_30;
  
  pCVar1 = (this->resolved).ptr.ptr;
  if (pCVar1 == (ClientHook *)0x0) {
    (*((this->inner).ptr)->_vptr_ClientHook[3])(&local_a8);
    local_78.isSet = local_a8.isSet;
    if (local_a8.isSet == true) {
      local_78.field_1.value.super_PromiseBase.node.disposer =
           local_a8.field_1.value.super_PromiseBase.node.disposer;
      local_78.field_1.value.super_PromiseBase.node.ptr =
           local_a8.field_1.value.super_PromiseBase.node.ptr;
      local_a8.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    }
    kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_>::~NullableValue(&local_a8);
    if (local_78.isSet == true) {
      (*((this->policy).ptr)->_vptr_MembranePolicy[3])(&local_90);
      local_a8.isSet = local_90.isSet;
      if (local_90.isSet == true) {
        local_a8.field_1.value.super_PromiseBase.node.disposer =
             local_90.field_1.value.super_PromiseBase.node.disposer;
        local_a8.field_1.value.super_PromiseBase.node.ptr =
             local_90.field_1.value.super_PromiseBase.node.ptr;
        local_90.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      }
      kj::_::NullableValue<kj::Promise<void>_>::~NullableValue(&local_90);
      this_00 = &local_78.field_1;
      if (local_a8.isSet == true) {
        pTVar2 = (TransformPromiseNodeBase *)operator_new(0x28);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (pTVar2,(Own<kj::_::PromiseNode> *)&local_a8.field_1.value,
                   kj::_::
                   TransformPromiseNode<kj::Own<capnp::ClientHook>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/membrane.c++:447:51),_kj::_::PropagateException>
                   ::anon_class_1_0_00000001_for_func::operator());
        (pTVar2->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0066ecb8;
        local_90._0_8_ =
             &kj::_::
              HeapDisposer<kj::_::TransformPromiseNode<kj::Own<capnp::ClientHook>,kj::_::Void,capnp::(anonymous_namespace)::MembraneHook::whenMoreResolved()::{lambda()#1},kj::_::PropagateException>>
              ::instance;
        local_40.disposer =
             (Disposer *)
             &kj::_::
              HeapDisposer<kj::_::TransformPromiseNode<kj::Own<capnp::ClientHook>,kj::_::Void,capnp::(anonymous_namespace)::MembraneHook::whenMoreResolved()::{lambda()#1},kj::_::PropagateException>>
              ::instance;
        local_90.field_1.value.super_PromiseBase.node.disposer = (Disposer *)0x0;
        local_60.disposer =
             (Disposer *)
             &kj::_::
              HeapDisposer<kj::_::TransformPromiseNode<kj::Own<capnp::ClientHook>,kj::_::Void,capnp::(anonymous_namespace)::MembraneHook::whenMoreResolved()::{lambda()#1},kj::_::PropagateException>>
              ::instance;
        local_40.ptr = (PromiseNode *)0x0;
        local_60.ptr = (PromiseNode *)pTVar2;
        kj::Own<kj::_::PromiseNode>::dispose(&local_40);
        kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_90);
        kj::Promise<kj::Own<capnp::ClientHook>_>::exclusiveJoin
                  ((Promise<kj::Own<capnp::ClientHook>_> *)&local_50,&this_00->value);
        kj::Own<kj::_::PromiseNode>::operator=((Own<kj::_::PromiseNode> *)&this_00->value,&local_50)
        ;
        kj::Own<kj::_::PromiseNode>::dispose(&local_50);
        kj::Own<kj::_::PromiseNode>::dispose(&local_60);
      }
      kj::_::NullableValue<kj::Promise<void>_>::~NullableValue
                ((NullableValue<kj::Promise<void>_> *)&local_a8);
      pTVar2 = (TransformPromiseNodeBase *)operator_new(0x30);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar2,(Own<kj::_::PromiseNode> *)&this_00->value,
                 kj::_::
                 TransformPromiseNode<kj::Own<capnp::ClientHook>,_kj::Own<capnp::ClientHook>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/membrane.c++:452:28),_kj::_::PropagateException>
                 ::anon_class_8_1_8991fb9c_for_func::operator());
      (pTVar2->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0066ed40;
      pTVar2[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)this;
      local_a8._0_8_ =
           &kj::_::
            HeapDisposer<kj::_::TransformPromiseNode<kj::Own<capnp::ClientHook>,kj::Own<capnp::ClientHook>,capnp::(anonymous_namespace)::MembraneHook::whenMoreResolved()::{lambda(kj::Own<capnp::ClientHook>&&)#1},kj::_::PropagateException>>
            ::instance;
      local_90._0_8_ =
           &kj::_::
            HeapDisposer<kj::_::TransformPromiseNode<kj::Own<capnp::ClientHook>,kj::Own<capnp::ClientHook>,capnp::(anonymous_namespace)::MembraneHook::whenMoreResolved()::{lambda(kj::Own<capnp::ClientHook>&&)#1},kj::_::PropagateException>>
            ::instance;
      local_a8.field_1.value.super_PromiseBase.node.disposer = (Disposer *)0x0;
      local_40.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::_::TransformPromiseNode<kj::Own<capnp::ClientHook>,kj::Own<capnp::ClientHook>,capnp::(anonymous_namespace)::MembraneHook::whenMoreResolved()::{lambda(kj::Own<capnp::ClientHook>&&)#1},kj::_::PropagateException>>
            ::instance;
      local_90.field_1.value.super_PromiseBase.node.disposer = (Disposer *)0x0;
      local_40.ptr = (PromiseNode *)pTVar2;
      kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_90);
      kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_a8);
      (__return_storage_ptr__->ptr).isSet = true;
      (__return_storage_ptr__->ptr).field_1.value.super_PromiseBase.node.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::_::TransformPromiseNode<kj::Own<capnp::ClientHook>,kj::Own<capnp::ClientHook>,capnp::(anonymous_namespace)::MembraneHook::whenMoreResolved()::{lambda(kj::Own<capnp::ClientHook>&&)#1},kj::_::PropagateException>>
            ::instance;
      (__return_storage_ptr__->ptr).field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)pTVar2
      ;
      local_40.ptr = (PromiseNode *)0x0;
      kj::Own<kj::_::PromiseNode>::dispose(&local_40);
    }
    else {
      (__return_storage_ptr__->ptr).isSet = false;
    }
    kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_>::~NullableValue(&local_78);
  }
  else {
    (*pCVar1->_vptr_ClientHook[4])(&local_30);
    kj::Promise<kj::Own<capnp::ClientHook>_>::Promise
              ((Promise<kj::Own<capnp::ClientHook>_> *)&local_78,&local_30);
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.super_PromiseBase.node.disposer =
         (Disposer *)CONCAT71(local_78._1_7_,local_78.isSet);
    (__return_storage_ptr__->ptr).field_1.value.super_PromiseBase.node.ptr =
         (PromiseNode *)local_78.field_1.value.super_PromiseBase.node.disposer;
    local_78.field_1.value.super_PromiseBase.node.disposer = (Disposer *)0x0;
    kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_78);
    kj::Own<capnp::ClientHook>::dispose(&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::Promise<kj::Own<ClientHook>>> whenMoreResolved() override {
    KJ_IF_MAYBE(r, resolved) {
      return kj::Promise<kj::Own<ClientHook>>(r->get()->addRef());
    }

    KJ_IF_MAYBE(promise, inner->whenMoreResolved()) {
      KJ_IF_MAYBE(r, policy->onRevoked()) {
        *promise = promise->exclusiveJoin(r->then([]() -> kj::Own<ClientHook> {
          KJ_FAIL_REQUIRE("onRevoked() promise resolved; it should only reject");
        }));
      }

      return promise->then([this](kj::Own<ClientHook>&& newInner) {
        kj::Own<ClientHook> newResolved = wrap(*newInner, *policy, reverse);
        if (resolved == nullptr) {
          resolved = newResolved->addRef();
        }
        return newResolved;
      });
    }